

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraEclipseCDT4Generator.cxx
# Opt level: O3

void __thiscall
cmExtraEclipseCDT4Generator::CreateLinksToSubprojects
          (cmExtraEclipseCDT4Generator *this,cmGeneratedFileStream *fout,string *baseDir)

{
  cmGlobalGenerator *pcVar1;
  size_t __n;
  bool bVar2;
  int iVar3;
  char *pcVar4;
  _Base_ptr p_Var5;
  string linkName;
  string linkSourceDirectory;
  string local_98;
  string local_78;
  cmGeneratedFileStream *local_58;
  string local_50;
  
  if (this->GenerateLinkedResources == true) {
    local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
    local_58 = fout;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"[Subprojects]","");
    local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"virtual:/virtual","");
    AppendLinkedResource(local_58,&local_78,&local_98,VirtualFolder);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
    }
    pcVar1 = (this->super_cmExternalMakefileProjectGenerator).GlobalGenerator;
    p_Var5 = (pcVar1->ProjectMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    if ((_Rb_tree_header *)p_Var5 != &(pcVar1->ProjectMap)._M_t._M_impl.super__Rb_tree_header) {
      do {
        pcVar4 = cmMakefile::GetCurrentSourceDirectory
                           (*(cmMakefile **)(**(long **)(p_Var5 + 2) + 0x28));
        std::__cxx11::string::string((string *)&local_98,pcVar4,(allocator *)&local_50);
        local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_78,local_98._M_dataplus._M_p,
                   local_98._M_dataplus._M_p + local_98._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_98._M_dataplus._M_p != &local_98.field_2) {
          operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
        }
        __n = baseDir->_M_string_length;
        if (__n == local_78._M_string_length) {
          if (__n != 0) {
            iVar3 = bcmp((baseDir->_M_dataplus)._M_p,local_78._M_dataplus._M_p,__n);
            if (iVar3 != 0) goto LAB_003c3411;
          }
        }
        else {
LAB_003c3411:
          bVar2 = cmsys::SystemTools::IsSubDirectory(baseDir,&local_78);
          if (!bVar2) {
            local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"[Subprojects]/","")
            ;
            std::__cxx11::string::_M_append((char *)&local_98,*(ulong *)(p_Var5 + 1));
            local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_50,local_78._M_dataplus._M_p,
                       local_78._M_dataplus._M_p + local_78._M_string_length);
            AppendLinkedResource(local_58,&local_98,&local_50,LinkToFolder);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_50._M_dataplus._M_p != &local_50.field_2) {
              operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_98._M_dataplus._M_p != &local_98.field_2) {
              operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
            }
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_78._M_dataplus._M_p != &local_78.field_2) {
          operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
        }
        p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5);
      } while ((_Rb_tree_header *)p_Var5 !=
               &(((this->super_cmExternalMakefileProjectGenerator).GlobalGenerator)->ProjectMap).
                _M_t._M_impl.super__Rb_tree_header);
    }
  }
  return;
}

Assistant:

void cmExtraEclipseCDT4Generator::CreateLinksToSubprojects(
                       cmGeneratedFileStream& fout, const std::string& baseDir)
{
  if (!this->GenerateLinkedResources)
    {
    return;
    }

  // for each sub project create a linked resource to the source dir
  // - only if it is an out-of-source build
  this->AppendLinkedResource(fout, "[Subprojects]",
                             "virtual:/virtual", VirtualFolder);

  for (std::map<std::string, std::vector<cmLocalGenerator*> >::const_iterator
       it = this->GlobalGenerator->GetProjectMap().begin();
       it != this->GlobalGenerator->GetProjectMap().end();
       ++it)
    {
    std::string linkSourceDirectory = this->GetEclipsePath(
                   it->second[0]->GetMakefile()->GetCurrentSourceDirectory());
    // a linked resource must not point to a parent directory of .project or
    // .project itself
    if ((baseDir != linkSourceDirectory) &&
        !cmSystemTools::IsSubDirectory(baseDir,
                                       linkSourceDirectory))
      {
      std::string linkName = "[Subprojects]/";
      linkName += it->first;
      this->AppendLinkedResource(fout, linkName,
                                 this->GetEclipsePath(linkSourceDirectory),
                                 LinkToFolder
                                );
      // Don't add it to the srcLinkedResources, because listing multiple
      // directories confuses the Eclipse indexer (#13596).
      }
    }
}